

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_strex.cc
# Opt level: O2

int do_hex_dump(BIO *out,uchar *buf,int buflen)

{
  undefined8 uVar1;
  undefined4 in_EAX;
  int iVar2;
  long lVar3;
  undefined2 uStack_38;
  char hextmp [2];
  int local_34;
  
  _uStack_38 = CONCAT44(buflen,in_EAX);
  if (out == (BIO *)0x0) {
LAB_003ca2e7:
    local_34 = local_34 * 2;
  }
  else {
    lVar3 = 0;
    do {
      uVar1 = _uStack_38;
      if (buflen == lVar3) goto LAB_003ca2e7;
      local_34 = SUB84(uVar1,4);
      _uStack_38 = CONCAT13("0123456789ABCDEF"[buf[lVar3] & 0xf],
                            CONCAT12("0123456789ABCDEF"[buf[lVar3] >> 4],uStack_38));
      iVar2 = maybe_write(out,hextmp,2);
      lVar3 = lVar3 + 1;
    } while (iVar2 != 0);
    local_34 = -1;
  }
  return local_34;
}

Assistant:

static int do_hex_dump(BIO *out, unsigned char *buf, int buflen) {
  static const char hexdig[] = "0123456789ABCDEF";
  unsigned char *p, *q;
  char hextmp[2];
  if (out) {
    p = buf;
    q = buf + buflen;
    while (p != q) {
      hextmp[0] = hexdig[*p >> 4];
      hextmp[1] = hexdig[*p & 0xf];
      if (!maybe_write(out, hextmp, 2)) {
        return -1;
      }
      p++;
    }
  }
  return buflen << 1;
}